

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O1

Ptr<Framebuffer> __thiscall
myvk::Framebuffer::Create
          (Framebuffer *this,Ptr<RenderPass> *render_pass,
          vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
          *image_views,VkExtent2D *extent,uint32_t layers)

{
  element_type *peVar1;
  PFN_vkCreateFramebuffer p_Var2;
  element_type *peVar3;
  uint uVar4;
  int iVar5;
  VkResult VVar6;
  undefined4 extraout_var;
  pointer psVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Ptr<Framebuffer> PVar10;
  shared_ptr<myvk::Framebuffer> ret;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> attachments;
  _func_int **local_a8;
  element_type *peStack_a0;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_90;
  undefined1 local_78 [56];
  ulong uStack_40;
  
  std::__shared_ptr<myvk::Framebuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Framebuffer>>
            ((__shared_ptr<myvk::Framebuffer,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (allocator<myvk::Framebuffer> *)local_78);
  local_a8[3] = (_func_int *)
                (render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 4),
             &(render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::operator=((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
               *)(local_a8 + 8),image_views);
  *(VkExtent2D *)(local_a8 + 6) = *extent;
  *(uint32_t *)(local_a8 + 7) = layers;
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
            (&local_90,
             (long)(image_views->
                   super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(image_views->
                   super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_78);
  psVar7 = (image_views->
           super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((image_views->
      super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar7) {
    uVar4 = 1;
    uVar8 = 0;
    do {
      local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] =
           (psVar7[uVar8].super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_image_view;
      uVar8 = (ulong)uVar4;
      psVar7 = (image_views->
               super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar8 < (ulong)((long)(image_views->
                                   super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4))
    ;
  }
  p_Var2 = vkCreateFramebuffer;
  local_78._8_8_ = (void *)0x0;
  local_78._16_8_ = 0;
  local_78._0_8_ = 0x25;
  peVar1 = (render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78._24_8_ = peVar1->m_render_pass;
  local_78._32_8_ =
       (ulong)((long)local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  local_78._40_8_ =
       local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78._48_8_ = *extent;
  uStack_40 = (ulong)layers;
  iVar5 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar6 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar5) + 0x268),
                    (VkFramebufferCreateInfo *)local_78,(VkAllocationCallbacks *)0x0,
                    (VkFramebuffer *)(local_a8 + 5));
  peVar3 = peStack_a0;
  if (VVar6 == VK_SUCCESS) {
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_a0 = (element_type *)0x0;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base._vptr_Base = local_a8;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_a8 = (_func_int **)0x0;
  }
  else {
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var9._M_pi = extraout_RDX;
  if (local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (peStack_a0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
    _Var9._M_pi = extraout_RDX_01;
  }
  PVar10.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  PVar10.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Framebuffer>)PVar10.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const std::vector<Ptr<ImageView>> &image_views,
                                     const VkExtent2D &extent, uint32_t layers) {
	auto ret = std::make_shared<Framebuffer>();
	ret->m_render_pass_ptr = render_pass;
	ret->m_image_view_ptrs = image_views;
	ret->m_extent = extent;
	ret->m_layers = layers;

	std::vector<VkImageView> attachments(image_views.size());
	for (uint32_t i = 0; i < image_views.size(); ++i)
		attachments[i] = image_views[i]->GetHandle();

	VkFramebufferCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.attachmentCount = attachments.size();
	create_info.pAttachments = attachments.data();
	create_info.width = extent.width;
	create_info.height = extent.height;
	create_info.layers = layers;

	if (vkCreateFramebuffer(render_pass->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_framebuffer) !=
	    VK_SUCCESS)
		return nullptr;

	return ret;
}